

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

float __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  allocator<char> local_1c5;
  float local_1c4;
  float fNum;
  locale local_1a0 [8];
  stringc c;
  istringstream sstr;
  
  iVar1 = (*(this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (this,CONCAT44(in_register_00000034,idx));
  if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
    local_1c4 = 0.0;
  }
  else {
    core::string<char>::string<char>(&c,(char *)CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::string<std::allocator<char>>((string *)&fNum,c.array,&local_1c5);
    std::__cxx11::istringstream::istringstream((istringstream *)&sstr,(string *)&fNum,_S_in);
    std::__cxx11::string::~string((string *)&fNum);
    std::locale::locale((locale *)&fNum,"C");
    std::ios::imbue(local_1a0);
    std::locale::~locale(local_1a0);
    std::locale::~locale((locale *)&fNum);
    std::istream::_M_extract<float>((float *)&sstr);
    local_1c4 = fNum;
    std::__cxx11::istringstream::~istringstream((istringstream *)&sstr);
    core::string<char>::~string(&c);
  }
  return local_1c4;
}

Assistant:

float getAttributeValueAsFloat(int idx) const
	{
		const char_type* attrvalue = getAttributeValue(idx);
		if (!attrvalue)
			return 0;

		core::stringc c = attrvalue;
		std::istringstream sstr(c.c_str());
		sstr.imbue(std::locale("C")); // Locale free number convert
		float fNum;
		sstr >> fNum;
		return fNum;
	}